

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

char * libtorrent::parse_int(char *start,char *end,char delimiter,int64_t *val,error_code_enum *ec)

{
  long lVar1;
  char *pcVar2;
  int64_t iVar3;
  error_code_enum eVar4;
  
  pcVar2 = start;
  if (start < end) {
    iVar3 = *val;
    do {
      if (*start == delimiter) {
        return start;
      }
      if (9 < (byte)(*start - 0x30U)) {
        eVar4 = expected_digit;
LAB_0018c1e7:
        *ec = eVar4;
        return start;
      }
      eVar4 = overflow;
      if (0xccccccccccccccc < iVar3) goto LAB_0018c1e7;
      lVar1 = iVar3 * 10;
      *val = lVar1;
      if (-0x7fffffffffffffd1 - (long)*start < lVar1) goto LAB_0018c1e7;
      iVar3 = lVar1 + *start + -0x30;
      *val = iVar3;
      start = start + 1;
      pcVar2 = end;
    } while (start != end);
  }
  return pcVar2;
}

Assistant:

char const* parse_int(char const* start, char const* end, char delimiter
		, std::int64_t& val, bdecode_errors::error_code_enum& ec)
	{
		while (start < end && *start != delimiter)
		{
			if (!numeric(*start))
			{
				ec = bdecode_errors::expected_digit;
				return start;
			}
			if (val > std::numeric_limits<std::int64_t>::max() / 10)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val *= 10;
			int digit = *start - '0';
			if (val > std::numeric_limits<std::int64_t>::max() - digit)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val += digit;
			++start;
		}
		return start;
	}